

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

double __thiscall Logger::log(Logger *this,double __x)

{
  char in_AL;
  char *in_RDX;
  LogLevel in_ESI;
  string message;
  va_list args;
  string sStack_108;
  __va_list_tag local_e8;
  undefined1 local_c8 [48];
  double local_98;
  
  if (in_AL != '\0') {
    local_98 = __x;
  }
  if (this->running == true) {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &message._M_string_length;
    local_e8.gp_offset = 0x18;
    local_e8.fp_offset = 0x30;
    format_abi_cxx11_(&sStack_108,this,in_RDX,&local_e8);
    addLogQueue(this,in_ESI,&sStack_108);
    __x = (double)std::__cxx11::string::~string((string *)&sStack_108);
  }
  return __x;
}

Assistant:

inline void log(LogLevel level, const char* fmt, ...) 
    {
        if(!running) return;
        va_list args;
        va_start(args, fmt);
        std::string message = format(fmt, args);
        va_end(args);
        addLogQueue(level, message);
    }